

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.cpp
# Opt level: O2

bool pbrt::GetMediumScatteringProperties
               (string *name,SpectrumHandle *sigma_a,SpectrumHandle *sigma_s,Allocator alloc)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  uintptr_t iptr;
  RGBUnboundedSpectrum *pRVar4;
  long lVar5;
  undefined1 *puVar6;
  polymorphic_allocator<std::byte> local_38;
  
  local_38.memoryResource = alloc.memoryResource;
  if (GetMediumScatteringProperties(std::__cxx11::string_const&,pbrt::SpectrumHandle*,pbrt::SpectrumHandle*,pstd::pmr::polymorphic_allocator<std::byte>)
      ::SubsurfaceParameterTable == '\0') {
    iVar3 = __cxa_guard_acquire(&GetMediumScatteringProperties(std::__cxx11::string_const&,pbrt::SpectrumHandle*,pbrt::SpectrumHandle*,pstd::pmr::polymorphic_allocator<std::byte>)
                                 ::SubsurfaceParameterTable);
    if (iVar3 != 0) {
      GetMediumScatteringProperties::SubsurfaceParameterTable[0].name = "Apple";
      GetMediumScatteringProperties::SubsurfaceParameterTable[0].sigma_prime_s.r = 2.29;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0].sigma_prime_s.g = 2.39;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0].sigma_prime_s.b = 1.97;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0].sigma_a.r = 0.003;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0].sigma_a.g = 0.0034;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0].sigma_a.b = 0.046;
      GetMediumScatteringProperties::SubsurfaceParameterTable[1].name = "Chicken1";
      GetMediumScatteringProperties::SubsurfaceParameterTable[1].sigma_prime_s.r = 0.15;
      GetMediumScatteringProperties::SubsurfaceParameterTable[1].sigma_prime_s.g = 0.21;
      GetMediumScatteringProperties::SubsurfaceParameterTable[1].sigma_prime_s.b = 0.38;
      GetMediumScatteringProperties::SubsurfaceParameterTable[1].sigma_a.r = 0.015;
      GetMediumScatteringProperties::SubsurfaceParameterTable[1].sigma_a.g = 0.077;
      GetMediumScatteringProperties::SubsurfaceParameterTable[1].sigma_a.b = 0.19;
      GetMediumScatteringProperties::SubsurfaceParameterTable[2].name = "Chicken2";
      GetMediumScatteringProperties::SubsurfaceParameterTable[2].sigma_prime_s.r = 0.19;
      GetMediumScatteringProperties::SubsurfaceParameterTable[2].sigma_prime_s.g = 0.25;
      GetMediumScatteringProperties::SubsurfaceParameterTable[2].sigma_prime_s.b = 0.32;
      GetMediumScatteringProperties::SubsurfaceParameterTable[2].sigma_a.r = 0.018;
      GetMediumScatteringProperties::SubsurfaceParameterTable[2].sigma_a.g = 0.088;
      GetMediumScatteringProperties::SubsurfaceParameterTable[2].sigma_a.b = 0.2;
      GetMediumScatteringProperties::SubsurfaceParameterTable[3].name = "Cream";
      GetMediumScatteringProperties::SubsurfaceParameterTable[3].sigma_prime_s.r = 7.38;
      GetMediumScatteringProperties::SubsurfaceParameterTable[3].sigma_prime_s.g = 5.47;
      GetMediumScatteringProperties::SubsurfaceParameterTable[3].sigma_prime_s.b = 3.15;
      GetMediumScatteringProperties::SubsurfaceParameterTable[3].sigma_a.r = 0.0002;
      GetMediumScatteringProperties::SubsurfaceParameterTable[3].sigma_a.g = 0.0028;
      GetMediumScatteringProperties::SubsurfaceParameterTable[3].sigma_a.b = 0.0163;
      GetMediumScatteringProperties::SubsurfaceParameterTable[4].name = "Ketchup";
      GetMediumScatteringProperties::SubsurfaceParameterTable[4].sigma_prime_s.r = 0.18;
      GetMediumScatteringProperties::SubsurfaceParameterTable[4].sigma_prime_s.g = 0.07;
      GetMediumScatteringProperties::SubsurfaceParameterTable[4].sigma_prime_s.b = 0.03;
      GetMediumScatteringProperties::SubsurfaceParameterTable[4].sigma_a.r = 0.061;
      GetMediumScatteringProperties::SubsurfaceParameterTable[4].sigma_a.g = 0.97;
      GetMediumScatteringProperties::SubsurfaceParameterTable[4].sigma_a.b = 1.45;
      GetMediumScatteringProperties::SubsurfaceParameterTable[5].name = "Marble";
      GetMediumScatteringProperties::SubsurfaceParameterTable[5].sigma_prime_s.r = 2.19;
      GetMediumScatteringProperties::SubsurfaceParameterTable[5].sigma_prime_s.g = 2.62;
      GetMediumScatteringProperties::SubsurfaceParameterTable[5].sigma_prime_s.b = 3.0;
      GetMediumScatteringProperties::SubsurfaceParameterTable[5].sigma_a.r = 0.0021;
      GetMediumScatteringProperties::SubsurfaceParameterTable[5].sigma_a.g = 0.0041;
      GetMediumScatteringProperties::SubsurfaceParameterTable[5].sigma_a.b = 0.0071;
      GetMediumScatteringProperties::SubsurfaceParameterTable[6].name = "Potato";
      GetMediumScatteringProperties::SubsurfaceParameterTable[6].sigma_prime_s.r = 0.68;
      GetMediumScatteringProperties::SubsurfaceParameterTable[6].sigma_prime_s.g = 0.7;
      GetMediumScatteringProperties::SubsurfaceParameterTable[6].sigma_prime_s.b = 0.55;
      GetMediumScatteringProperties::SubsurfaceParameterTable[6].sigma_a.r = 0.0024;
      GetMediumScatteringProperties::SubsurfaceParameterTable[6].sigma_a.g = 0.009;
      GetMediumScatteringProperties::SubsurfaceParameterTable[6].sigma_a.b = 0.12;
      GetMediumScatteringProperties::SubsurfaceParameterTable[7].name = "Skimmilk";
      GetMediumScatteringProperties::SubsurfaceParameterTable[7].sigma_prime_s.r = 0.7;
      GetMediumScatteringProperties::SubsurfaceParameterTable[7].sigma_prime_s.g = 1.22;
      GetMediumScatteringProperties::SubsurfaceParameterTable[7].sigma_prime_s.b = 1.9;
      GetMediumScatteringProperties::SubsurfaceParameterTable[7].sigma_a.r = 0.0014;
      GetMediumScatteringProperties::SubsurfaceParameterTable[7].sigma_a.g = 0.0025;
      GetMediumScatteringProperties::SubsurfaceParameterTable[7].sigma_a.b = 0.0142;
      GetMediumScatteringProperties::SubsurfaceParameterTable[8].name = "Skin1";
      GetMediumScatteringProperties::SubsurfaceParameterTable[8].sigma_prime_s.r = 0.74;
      GetMediumScatteringProperties::SubsurfaceParameterTable[8].sigma_prime_s.g = 0.88;
      GetMediumScatteringProperties::SubsurfaceParameterTable[8].sigma_prime_s.b = 1.01;
      GetMediumScatteringProperties::SubsurfaceParameterTable[8].sigma_a.r = 0.032;
      GetMediumScatteringProperties::SubsurfaceParameterTable[8].sigma_a.g = 0.17;
      GetMediumScatteringProperties::SubsurfaceParameterTable[8].sigma_a.b = 0.48;
      GetMediumScatteringProperties::SubsurfaceParameterTable[9].name = "Skin2";
      GetMediumScatteringProperties::SubsurfaceParameterTable[9].sigma_prime_s.r = 1.09;
      GetMediumScatteringProperties::SubsurfaceParameterTable[9].sigma_prime_s.g = 1.59;
      GetMediumScatteringProperties::SubsurfaceParameterTable[9].sigma_prime_s.b = 1.79;
      GetMediumScatteringProperties::SubsurfaceParameterTable[9].sigma_a.r = 0.013;
      GetMediumScatteringProperties::SubsurfaceParameterTable[9].sigma_a.g = 0.07;
      GetMediumScatteringProperties::SubsurfaceParameterTable[9].sigma_a.b = 0.145;
      GetMediumScatteringProperties::SubsurfaceParameterTable[10].name = "Spectralon";
      GetMediumScatteringProperties::SubsurfaceParameterTable[10].sigma_prime_s.r = 11.6;
      GetMediumScatteringProperties::SubsurfaceParameterTable[10].sigma_prime_s.g = 20.4;
      GetMediumScatteringProperties::SubsurfaceParameterTable[10].sigma_prime_s.b = 14.9;
      GetMediumScatteringProperties::SubsurfaceParameterTable[10].sigma_a.r = 0.0;
      GetMediumScatteringProperties::SubsurfaceParameterTable[10].sigma_a.g = 0.0;
      GetMediumScatteringProperties::SubsurfaceParameterTable[10].sigma_a.b = 0.0;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0xb].name = "Wholemilk";
      GetMediumScatteringProperties::SubsurfaceParameterTable[0xb].sigma_prime_s.r = 2.55;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0xb].sigma_prime_s.g = 3.21;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0xb].sigma_prime_s.b = 3.77;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0xb].sigma_a.r = 0.0011;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0xb].sigma_a.g = 0.0024;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0xb].sigma_a.b = 0.014;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0xc].name = "Lowfat Milk";
      GetMediumScatteringProperties::SubsurfaceParameterTable[0xc].sigma_prime_s.r = 0.89187;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0xc].sigma_prime_s.g = 1.5136;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0xc].sigma_prime_s.b = 2.532;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0xc].sigma_a.r = 0.002875;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0xc].sigma_a.g = 0.00575;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0xc].sigma_a.b = 0.0115;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0xd].name = "Reduced Milk";
      GetMediumScatteringProperties::SubsurfaceParameterTable[0xd].sigma_prime_s.r = 2.4858;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0xd].sigma_prime_s.g = 3.1669;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0xd].sigma_prime_s.b = 4.5214;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0xd].sigma_a.r = 0.0025556;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0xd].sigma_a.g = 0.0051111;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0xd].sigma_a.b = 0.012778;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0xe].name = "Regular Milk";
      GetMediumScatteringProperties::SubsurfaceParameterTable[0xe].sigma_prime_s.r = 4.5513;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0xe].sigma_prime_s.g = 5.8294;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0xe].sigma_prime_s.b = 7.136;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0xe].sigma_a.r = 0.0015333;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0xe].sigma_a.g = 0.0046;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0xe].sigma_a.b = 0.019933;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0xf].name = "Espresso";
      GetMediumScatteringProperties::SubsurfaceParameterTable[0xf].sigma_prime_s.r = 0.72378;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0xf].sigma_prime_s.g = 0.84557;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0xf].sigma_prime_s.b = 1.0247;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0xf].sigma_a.r = 4.7984;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0xf].sigma_a.g = 6.5751;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0xf].sigma_a.b = 8.8493;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x10].name = "Mint Mocha Coffee";
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x10].sigma_prime_s.r = 0.31602;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x10].sigma_prime_s.g = 0.38538;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x10].sigma_prime_s.b = 0.48131;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x10].sigma_a.r = 3.772;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x10].sigma_a.g = 5.8228;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x10].sigma_a.b = 7.82;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x11].name = "Lowfat Soy Milk";
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x11].sigma_prime_s.r = 0.30576;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x11].sigma_prime_s.g = 0.34233;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x11].sigma_prime_s.b = 0.61664;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x11].sigma_a.r = 0.0014375;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x11].sigma_a.g = 0.0071875;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x11].sigma_a.b = 0.035937;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x12].name = "Regular Soy Milk";
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x12].sigma_prime_s.r = 0.59223;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x12].sigma_prime_s.g = 0.73866;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x12].sigma_prime_s.b = 1.4693;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x12].sigma_a.r = 0.0019167;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x12].sigma_a.g = 0.0095833;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x12].sigma_a.b = 0.065167;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x13].name = "Lowfat Chocolate Milk";
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x13].sigma_prime_s.r = 0.64925;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x13].sigma_prime_s.g = 0.83916;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x13].sigma_prime_s.b = 1.1057;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x13].sigma_a.r = 0.0115;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x13].sigma_a.g = 0.0368;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x13].sigma_a.b = 0.1564;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x14].name = "Regular Chocolate Milk";
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x14].sigma_prime_s.r = 1.4585;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x14].sigma_prime_s.g = 2.1289;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x14].sigma_prime_s.b = 2.9527;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x14].sigma_a.r = 0.010063;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x14].sigma_a.g = 0.043125;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x14].sigma_a.b = 0.14375;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x15].name = "Coke";
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x15].sigma_prime_s.r = 8.9053e-05;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x15].sigma_prime_s.g = 8.372e-05;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x15].sigma_prime_s.b = 0.0;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x15].sigma_a.r = 0.10014;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x15].sigma_a.g = 0.16503;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x15].sigma_a.b = 0.2468;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x16].name = "Pepsi";
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x16].sigma_prime_s.r = 6.1697e-05;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x16].sigma_prime_s.g = 4.2564e-05;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x16].sigma_prime_s.b = 0.0;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x16].sigma_a.r = 0.091641;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x16].sigma_a.g = 0.14158;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x16].sigma_a.b = 0.20729;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x17].name = "Sprite";
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x17].sigma_prime_s.r = 6.0306e-06;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x17].sigma_prime_s.g = 6.4139e-06;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x17].sigma_prime_s.b = 6.5504e-06;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x17].sigma_a.r = 0.001886;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x17].sigma_a.g = 0.0018308;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x17].sigma_a.b = 0.0020025;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x18].name = "Gatorade";
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x18].sigma_prime_s.r = 0.0024574;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x18].sigma_prime_s.g = 0.003007;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x18].sigma_prime_s.b = 0.0037325;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x18].sigma_a.r = 0.024794;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x18].sigma_a.g = 0.019289;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x18].sigma_a.b = 0.008878;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x19].name = "Chardonnay";
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x19].sigma_prime_s.r = 1.7982e-05;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x19].sigma_prime_s.g = 1.3758e-05;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x19].sigma_prime_s.b = 1.2023e-05;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x19].sigma_a.r = 0.010782;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x19].sigma_a.g = 0.011855;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x19].sigma_a.b = 0.023997;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x1a].name = "White Zinfandel";
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x1a].sigma_prime_s.r = 1.7501e-05;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x1a].sigma_prime_s.g = 1.9069e-05;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x1a].sigma_prime_s.b = 1.288e-05;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x1a].sigma_a.r = 0.012072;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x1a].sigma_a.g = 0.016184;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x1a].sigma_a.b = 0.019843;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x1b].name = "Merlot";
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x1b].sigma_prime_s.r = 2.1129e-05;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x1b].sigma_prime_s.g = 0.0;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x1b].sigma_prime_s.b = 0.0;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x1b].sigma_a.r = 0.11632;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x1b].sigma_a.g = 0.25191;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x1b].sigma_a.b = 0.29434;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x1c].name = "Budweiser Beer";
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x1c].sigma_prime_s.r = 2.4356e-05;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x1c].sigma_prime_s.g = 2.4079e-05;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x1c].sigma_prime_s.b = 1.0564e-05;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x1c].sigma_a.r = 0.011492;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x1c].sigma_a.g = 0.024911;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x1c].sigma_a.b = 0.057786;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x1d].name = "Coors Light Beer";
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x1d].sigma_prime_s.r = 5.0922e-05;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x1d].sigma_prime_s.g = 4.301e-05;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x1d].sigma_prime_s.b = 0.0;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x1d].sigma_a.r = 0.006164;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x1d].sigma_a.g = 0.013984;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x1d].sigma_a.b = 0.034983;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x1e].name = "Clorox";
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x1e].sigma_prime_s.r = 0.0024035;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x1e].sigma_prime_s.g = 0.0031373;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x1e].sigma_prime_s.b = 0.003991;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x1e].sigma_a.r = 0.0033542;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x1e].sigma_a.g = 0.014892;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x1e].sigma_a.b = 0.026297;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x1f].name = "Apple Juice";
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x1f].sigma_prime_s.r = 0.00013612;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x1f].sigma_prime_s.g = 0.00015836;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x1f].sigma_prime_s.b = 0.000227;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x1f].sigma_a.r = 0.012957;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x1f].sigma_a.g = 0.023741;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x1f].sigma_a.b = 0.052184;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x20].name = "Cranberry Juice";
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x20].sigma_prime_s.r = 0.00010402;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x20].sigma_prime_s.g = 0.00011646;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x20].sigma_prime_s.b = 7.8139e-05;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x20].sigma_a.r = 0.039437;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x20].sigma_a.g = 0.094223;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x20].sigma_a.b = 0.12426;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x21].name = "Grape Juice";
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x21].sigma_prime_s.r = 5.382e-05;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x21].sigma_prime_s.g = 0.0;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x21].sigma_prime_s.b = 0.0;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x21].sigma_a.r = 0.10404;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x21].sigma_a.g = 0.23958;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x21].sigma_a.b = 0.29325;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x22].name = "Ruby Grapefruit Juice";
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x22].sigma_prime_s.r = 0.011002;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x22].sigma_prime_s.g = 0.010927;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x22].sigma_prime_s.b = 0.011036;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x22].sigma_a.r = 0.085867;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x22].sigma_a.g = 0.18314;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x22].sigma_a.b = 0.25262;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x23].name = "White Grapefruit Juice";
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x23].sigma_prime_s.r = 0.22826;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x23].sigma_prime_s.g = 0.23998;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x23].sigma_prime_s.b = 0.32748;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x23].sigma_a.r = 0.0138;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x23].sigma_a.g = 0.018831;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x23].sigma_a.b = 0.056781;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x24].name = "Shampoo";
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x24].sigma_prime_s.r = 0.0007176;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x24].sigma_prime_s.g = 0.0008303;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x24].sigma_prime_s.b = 0.0009016;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x24].sigma_a.r = 0.014107;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x24].sigma_a.g = 0.045693;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x24].sigma_a.b = 0.061717;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x25].name = "Strawberry Shampoo";
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x25].sigma_prime_s.r = 0.00015671;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x25].sigma_prime_s.g = 0.00015947;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x25].sigma_prime_s.b = 1.518e-05;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x25].sigma_a.r = 0.01449;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x25].sigma_a.g = 0.05796;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x25].sigma_a.b = 0.075823;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x26].name =
           "Head & Shoulders Shampoo";
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x26].sigma_prime_s.r = 0.023805;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x26].sigma_prime_s.g = 0.028804;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x26].sigma_prime_s.b = 0.034306;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x26].sigma_a.r = 0.084621;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x26].sigma_a.g = 0.15688;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x26].sigma_a.b = 0.20365;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x27].name = "Lemon Tea Powder";
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x27].sigma_prime_s.r = 0.040224;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x27].sigma_prime_s.g = 0.045264;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x27].sigma_prime_s.b = 0.051081;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x27].sigma_a.r = 2.4288;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x27].sigma_a.g = 4.5757;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x27].sigma_a.b = 7.2127;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x28].name = "Orange Powder";
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x28].sigma_prime_s.r = 0.00015617;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x28].sigma_prime_s.g = 0.00017482;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x28].sigma_prime_s.b = 0.0001762;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x28].sigma_a.r = 0.001449;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x28].sigma_a.g = 0.003441;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x28].sigma_a.b = 0.007863;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x29].name = "Pink Lemonade Powder";
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x29].sigma_prime_s.r = 0.00012103;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x29].sigma_prime_s.g = 0.00013073;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x29].sigma_prime_s.b = 0.00012528;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x29].sigma_a.r = 0.001165;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x29].sigma_a.g = 0.002366;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x29].sigma_a.b = 0.003195;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x2a].name = "Cappuccino Powder";
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x2a].sigma_prime_s.r = 1.8436;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x2a].sigma_prime_s.g = 2.5851;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x2a].sigma_prime_s.b = 2.1662;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x2a].sigma_a.r = 35.844;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x2a].sigma_a.g = 49.547;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x2a].sigma_a.b = 61.084;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x2b].name = "Salt Powder";
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x2b].sigma_prime_s.r = 0.027333;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x2b].sigma_prime_s.g = 0.032451;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x2b].sigma_prime_s.b = 0.031979;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x2b].sigma_a.r = 0.28415;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x2b].sigma_a.g = 0.3257;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x2b].sigma_a.b = 0.34148;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x2c].name = "Sugar Powder";
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x2c].sigma_prime_s.r = 0.00022272;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x2c].sigma_prime_s.g = 0.00025513;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x2c].sigma_prime_s.b = 0.000271;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x2c].sigma_a.r = 0.012638;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x2c].sigma_a.g = 0.031051;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x2c].sigma_a.b = 0.050124;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x2d].name = "Suisse Mocha Powder";
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x2d].sigma_prime_s.r = 2.7979;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x2d].sigma_prime_s.g = 3.5452;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x2d].sigma_prime_s.b = 4.3365;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x2d].sigma_a.r = 17.502;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x2d].sigma_a.g = 27.004;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x2d].sigma_a.b = 35.433;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x2e].name =
           "Pacific Ocean Surface Water";
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x2e].sigma_prime_s.r = 0.0001764;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x2e].sigma_prime_s.g = 0.00032095;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x2e].sigma_prime_s.b = 0.00019617;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x2e].sigma_a.r = 0.031845;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x2e].sigma_a.g = 0.031324;
      GetMediumScatteringProperties::SubsurfaceParameterTable[0x2e].sigma_a.b = 0.030147;
      __cxa_guard_release(&GetMediumScatteringProperties(std::__cxx11::string_const&,pbrt::SpectrumHandle*,pbrt::SpectrumHandle*,pstd::pmr::polymorphic_allocator<std::byte>)
                           ::SubsurfaceParameterTable);
    }
  }
  puVar6 = &std::__ioinit;
  lVar1 = 0;
  do {
    lVar5 = lVar1;
    if (lVar5 == -0x5e0) goto LAB_0031da28;
    bVar2 = std::operator==(name,*(char **)(puVar6 + 0xc));
    puVar6 = puVar6 + 0x20;
    lVar1 = lVar5 + -0x20;
  } while (!bVar2);
  lVar1 = -(lVar5 + -0x20);
  pRVar4 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::RGBUnboundedSpectrum,pbrt::RGBColorSpace_const&,pbrt::RGB&>
                     (&local_38,RGBColorSpace::sRGB,(RGB *)(&std::__ioinit + lVar1));
  (sigma_a->
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  ).bits = (ulong)pRVar4 | 0x5000000000000;
  pRVar4 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::RGBUnboundedSpectrum,pbrt::RGBColorSpace_const&,pbrt::RGB&>
                     (&local_38,RGBColorSpace::sRGB,(RGB *)(XYZFromLMS + lVar1 + 0x18));
  (sigma_s->
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  ).bits = (ulong)pRVar4 | 0x5000000000000;
LAB_0031da28:
  return lVar5 != -0x5e0;
}

Assistant:

bool GetMediumScatteringProperties(const std::string &name, SpectrumHandle *sigma_a,
                                   SpectrumHandle *sigma_s, Allocator alloc) {
    static MeasuredSS SubsurfaceParameterTable[] = {
        // From "A Practical Model for Subsurface Light Transport"
        // Jensen, Marschner, Levoy, Hanrahan
        // Proc SIGGRAPH 2001
        // clang-format off
        {"Apple", RGB(2.29, 2.39, 1.97), RGB(0.0030, 0.0034, 0.046)},
        {"Chicken1", RGB(0.15, 0.21, 0.38), RGB(0.015, 0.077, 0.19)},
        {"Chicken2", RGB(0.19, 0.25, 0.32), RGB(0.018, 0.088, 0.20)},
        {"Cream", RGB(7.38, 5.47, 3.15), RGB(0.0002, 0.0028, 0.0163)},
        {"Ketchup", RGB(0.18, 0.07, 0.03), RGB(0.061, 0.97, 1.45)},
        {"Marble", RGB(2.19, 2.62, 3.00), RGB(0.0021, 0.0041, 0.0071)},
        {"Potato", RGB(0.68, 0.70, 0.55), RGB(0.0024, 0.0090, 0.12)},
        {"Skimmilk", RGB(0.70, 1.22, 1.90), RGB(0.0014, 0.0025, 0.0142)},
        {"Skin1", RGB(0.74, 0.88, 1.01), RGB(0.032, 0.17, 0.48)},
        {"Skin2", RGB(1.09, 1.59, 1.79), RGB(0.013, 0.070, 0.145)},
        {"Spectralon", RGB(11.6, 20.4, 14.9), RGB(0.00, 0.00, 0.00)},
        {"Wholemilk", RGB(2.55, 3.21, 3.77), RGB(0.0011, 0.0024, 0.014)},

        // From "Acquiring Scattering Properties of Participating Media by
        // Dilution",
        // Narasimhan, Gupta, Donner, Ramamoorthi, Nayar, Jensen
        // Proc SIGGRAPH 2006
        {"Lowfat Milk", RGB(0.89187, 1.5136, 2.532), RGB(0.002875, 0.00575, 0.0115)},
        {"Reduced Milk", RGB(2.4858, 3.1669, 4.5214), RGB(0.0025556, 0.0051111, 0.012778)},
        {"Regular Milk", RGB(4.5513, 5.8294, 7.136), RGB(0.0015333, 0.0046, 0.019933)},
        {"Espresso", RGB(0.72378, 0.84557, 1.0247), RGB(4.7984, 6.5751, 8.8493)},
        {"Mint Mocha Coffee", RGB(0.31602, 0.38538, 0.48131), RGB(3.772, 5.8228, 7.82)},
        {"Lowfat Soy Milk", RGB(0.30576, 0.34233, 0.61664), RGB(0.0014375, 0.0071875, 0.035937)},
        {"Regular Soy Milk", RGB(0.59223, 0.73866, 1.4693), RGB(0.0019167, 0.0095833, 0.065167)},
        {"Lowfat Chocolate Milk", RGB(0.64925, 0.83916, 1.1057), RGB(0.0115, 0.0368, 0.1564)},
        {"Regular Chocolate Milk", RGB(1.4585, 2.1289, 2.9527), RGB(0.010063, 0.043125, 0.14375)},
        {"Coke", RGB(8.9053e-05, 8.372e-05, 0), RGB(0.10014, 0.16503, 0.2468)},
        {"Pepsi", RGB(6.1697e-05, 4.2564e-05, 0), RGB(0.091641, 0.14158, 0.20729)},
        {"Sprite", RGB(6.0306e-06, 6.4139e-06, 6.5504e-06), RGB(0.001886, 0.0018308, 0.0020025)},
        {"Gatorade", RGB(0.0024574, 0.003007, 0.0037325), RGB(0.024794, 0.019289, 0.008878)},
        {"Chardonnay", RGB(1.7982e-05, 1.3758e-05, 1.2023e-05), RGB(0.010782, 0.011855, 0.023997)},
        {"White Zinfandel", RGB(1.7501e-05, 1.9069e-05, 1.288e-05), RGB(0.012072, 0.016184, 0.019843)},
        {"Merlot", RGB(2.1129e-05, 0, 0), RGB(0.11632, 0.25191, 0.29434)},
        {"Budweiser Beer", RGB(2.4356e-05, 2.4079e-05, 1.0564e-05), RGB(0.011492, 0.024911, 0.057786)},
        {"Coors Light Beer", RGB(5.0922e-05, 4.301e-05, 0), RGB(0.006164, 0.013984, 0.034983)},
        {"Clorox", RGB(0.0024035, 0.0031373, 0.003991), RGB(0.0033542, 0.014892, 0.026297)},
        {"Apple Juice", RGB(0.00013612, 0.00015836, 0.000227), RGB(0.012957, 0.023741, 0.052184)},
        {"Cranberry Juice", RGB(0.00010402, 0.00011646, 7.8139e-05), RGB(0.039437, 0.094223, 0.12426)},
        {"Grape Juice", RGB(5.382e-05, 0, 0), RGB(0.10404, 0.23958, 0.29325)},
        {"Ruby Grapefruit Juice", RGB(0.011002, 0.010927, 0.011036), RGB(0.085867, 0.18314, 0.25262)},
        {"White Grapefruit Juice", RGB(0.22826, 0.23998, 0.32748), RGB(0.0138, 0.018831, 0.056781)},
        {"Shampoo", RGB(0.0007176, 0.0008303, 0.0009016), RGB(0.014107, 0.045693, 0.061717)},
        {"Strawberry Shampoo", RGB(0.00015671, 0.00015947, 1.518e-05), RGB(0.01449, 0.05796, 0.075823)},
        {"Head & Shoulders Shampoo", RGB(0.023805, 0.028804, 0.034306), RGB(0.084621, 0.15688, 0.20365)},
        {"Lemon Tea Powder", RGB(0.040224, 0.045264, 0.051081), RGB(2.4288, 4.5757, 7.2127)},
        {"Orange Powder", RGB(0.00015617, 0.00017482, 0.0001762), RGB(0.001449, 0.003441, 0.007863)},
        {"Pink Lemonade Powder", RGB(0.00012103, 0.00013073, 0.00012528), RGB(0.001165, 0.002366, 0.003195)},
        {"Cappuccino Powder", RGB(1.8436, 2.5851, 2.1662), RGB(35.844, 49.547, 61.084)},
        {"Salt Powder", RGB(0.027333, 0.032451, 0.031979), RGB(0.28415, 0.3257, 0.34148)},
        {"Sugar Powder", RGB(0.00022272, 0.00025513, 0.000271), RGB(0.012638, 0.031051, 0.050124)},
        {"Suisse Mocha Powder", RGB(2.7979, 3.5452, 4.3365), RGB(17.502, 27.004, 35.433)},
        {"Pacific Ocean Surface Water", RGB(0.0001764, 0.00032095, 0.00019617), RGB(0.031845, 0.031324, 0.030147)}
        // clang-format on
    };

    for (MeasuredSS &mss : SubsurfaceParameterTable) {
        if (name == mss.name) {
            *sigma_a =
                alloc.new_object<RGBUnboundedSpectrum>(*RGBColorSpace::sRGB, mss.sigma_a);
            *sigma_s = alloc.new_object<RGBUnboundedSpectrum>(*RGBColorSpace::sRGB,
                                                              mss.sigma_prime_s);
            return true;
        }
    }
    return false;
}